

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcWorkControl::IfcWorkControl(IfcWorkControl *this)

{
  IfcWorkControl *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x200,"IfcWorkControl");
  IfcControl::IfcControl((IfcControl *)this,&PTR_construction_vtable_24__00fa53f0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>,
             &PTR_construction_vtable_24__00fa54a0);
  *(undefined8 *)this = 0xfa5310;
  *(undefined8 *)&this->field_0x200 = 0xfa53d8;
  *(undefined8 *)&this->field_0x88 = 0xfa5338;
  *(undefined8 *)&this->field_0x98 = 0xfa5360;
  *(undefined8 *)&this->field_0xd0 = 0xfa5388;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>)._vptr_ObjectHelper =
       (_func_int **)0xfa53b0;
  std::__cxx11::string::string
            ((string *)
             &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcWorkControl,_10UL>).field_0x10);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->CreationDate);
  STEP::
  Maybe<Assimp::STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::NotImplemented>,_1UL,_0UL>_>
  ::Maybe(&this->Creators);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->Purpose);
  STEP::Maybe<double>::Maybe(&this->Duration);
  STEP::Maybe<double>::Maybe(&this->TotalFloat);
  std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>::shared_ptr(&this->StartTime);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->FinishTime);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->WorkControlType);
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe(&this->UserDefinedControlType);
  return;
}

Assistant:

IfcWorkControl() : Object("IfcWorkControl") {}